

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::
PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~MonomorphicImpl
          (MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this)

{
  ~MonomorphicImpl(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit MonomorphicImpl(const Impl& impl) : impl_(impl) {}